

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::ConstBool<unsigned_long_long>(void)

{
  bool bVar1;
  int local_20 [2];
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_10;
  
  local_20[1] = 2;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_10,local_20 + 1);
  if (local_10.m_int == 0) {
    bVar1 = false;
  }
  else {
    local_20[0] = 0;
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_18,local_20);
    bVar1 = local_18.m_int == 0;
  }
  return bVar1;
}

Assistant:

SAFEINT_CONSTEXPR11 bool ConstBool()
	{
		return (bool)SafeInt<T>(2) && !SafeInt<T>(0);
	}